

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_start_row(png_structrp png_ptr)

{
  byte bVar1;
  uint uVar2;
  png_bytep ppVar3;
  byte bVar4;
  ulong uVar5;
  png_alloc_size_t size;
  
  uVar2 = (uint)png_ptr->usr_bit_depth * (uint)png_ptr->usr_channels;
  if (uVar2 < 8) {
    uVar5 = (ulong)png_ptr->width * (ulong)uVar2 + 7 >> 3;
  }
  else {
    uVar5 = (ulong)png_ptr->width * (ulong)(uVar2 >> 3);
  }
  size = uVar5 + 1;
  png_ptr->transformed_pixel_depth = png_ptr->pixel_depth;
  png_ptr->maximum_pixel_depth = (png_byte)uVar2;
  ppVar3 = (png_bytep)png_malloc(png_ptr,size);
  png_ptr->row_buf = ppVar3;
  *ppVar3 = '\0';
  bVar4 = png_ptr->do_filter & 0x1f;
  if (png_ptr->height != 1) {
    bVar4 = png_ptr->do_filter;
  }
  bVar1 = bVar4 & 0x2f;
  if (png_ptr->width != 1) {
    bVar1 = bVar4;
  }
  bVar4 = 8;
  if (bVar1 != 0) {
    bVar4 = bVar1;
  }
  png_ptr->do_filter = bVar4;
  if (0xf < bVar4) {
    if (png_ptr->try_row == (png_bytep)0x0) {
      ppVar3 = (png_bytep)png_malloc(png_ptr,size);
      png_ptr->try_row = ppVar3;
      if (1 < (byte)((((bVar4 >> 5 & 1) != 0) - ((char)bVar4 >> 7)) + (bVar4 >> 4 & 1) +
                    ((bVar4 >> 6 & 1) != 0))) {
        ppVar3 = (png_bytep)png_malloc(png_ptr,size);
        png_ptr->tst_row = ppVar3;
      }
    }
    if (0x1f < bVar4) {
      ppVar3 = (png_bytep)png_calloc(png_ptr,size);
      png_ptr->prev_row = ppVar3;
    }
  }
  if (png_ptr->interlaced == '\0') {
    uVar2 = png_ptr->width;
    png_ptr->num_rows = png_ptr->height;
  }
  else if ((png_ptr->transformations & 2) == 0) {
    png_ptr->num_rows = png_ptr->height + 7 >> 3;
    uVar2 = png_ptr->width + 7 >> 3;
  }
  else {
    png_ptr->num_rows = png_ptr->height;
    uVar2 = png_ptr->width;
  }
  png_ptr->usr_width = uVar2;
  return;
}

Assistant:

void /* PRIVATE */
png_write_start_row(png_structrp png_ptr)
{
#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */

   /* Start of interlace block */
   static const png_byte png_pass_start[7] = {0, 4, 0, 2, 0, 1, 0};

   /* Offset to next interlace block */
   static const png_byte png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   /* Start of interlace block in the y direction */
   static const png_byte png_pass_ystart[7] = {0, 0, 4, 0, 2, 0, 1};

   /* Offset to next interlace block in the y direction */
   static const png_byte png_pass_yinc[7] = {8, 8, 8, 4, 4, 2, 2};
#endif

   png_alloc_size_t buf_size;
   int usr_pixel_depth;

#ifdef PNG_WRITE_FILTER_SUPPORTED
   png_byte filters;
#endif

   png_debug(1, "in png_write_start_row");

   usr_pixel_depth = png_ptr->usr_channels * png_ptr->usr_bit_depth;
   buf_size = PNG_ROWBYTES(usr_pixel_depth, png_ptr->width) + 1;

   /* 1.5.6: added to allow checking in the row write code. */
   png_ptr->transformed_pixel_depth = png_ptr->pixel_depth;
   png_ptr->maximum_pixel_depth = (png_byte)usr_pixel_depth;

   /* Set up row buffer */
   png_ptr->row_buf = png_voidcast(png_bytep, png_malloc(png_ptr, buf_size));

   png_ptr->row_buf[0] = PNG_FILTER_VALUE_NONE;

#ifdef PNG_WRITE_FILTER_SUPPORTED
   filters = png_ptr->do_filter;

   if (png_ptr->height == 1)
      filters &= 0xff & ~(PNG_FILTER_UP|PNG_FILTER_AVG|PNG_FILTER_PAETH);

   if (png_ptr->width == 1)
      filters &= 0xff & ~(PNG_FILTER_SUB|PNG_FILTER_AVG|PNG_FILTER_PAETH);

   if (filters == 0)
      filters = PNG_FILTER_NONE;

   png_ptr->do_filter = filters;

   if (((filters & (PNG_FILTER_SUB | PNG_FILTER_UP | PNG_FILTER_AVG |
       PNG_FILTER_PAETH)) != 0) && png_ptr->try_row == NULL)
   {
      int num_filters = 0;

      png_ptr->try_row = png_voidcast(png_bytep, png_malloc(png_ptr, buf_size));

      if (filters & PNG_FILTER_SUB)
         num_filters++;

      if (filters & PNG_FILTER_UP)
         num_filters++;

      if (filters & PNG_FILTER_AVG)
         num_filters++;

      if (filters & PNG_FILTER_PAETH)
         num_filters++;

      if (num_filters > 1)
         png_ptr->tst_row = png_voidcast(png_bytep, png_malloc(png_ptr,
             buf_size));
   }

   /* We only need to keep the previous row if we are using one of the following
    * filters.
    */
   if ((filters & (PNG_FILTER_AVG | PNG_FILTER_UP | PNG_FILTER_PAETH)) != 0)
      png_ptr->prev_row = png_voidcast(png_bytep,
          png_calloc(png_ptr, buf_size));
#endif /* WRITE_FILTER */

#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   /* If interlaced, we need to set up width and height of pass */
   if (png_ptr->interlaced != 0)
   {
      if ((png_ptr->transformations & PNG_INTERLACE) == 0)
      {
         png_ptr->num_rows = (png_ptr->height + png_pass_yinc[0] - 1 -
             png_pass_ystart[0]) / png_pass_yinc[0];

         png_ptr->usr_width = (png_ptr->width + png_pass_inc[0] - 1 -
             png_pass_start[0]) / png_pass_inc[0];
      }

      else
      {
         png_ptr->num_rows = png_ptr->height;
         png_ptr->usr_width = png_ptr->width;
      }
   }

   else
#endif
   {
      png_ptr->num_rows = png_ptr->height;
      png_ptr->usr_width = png_ptr->width;
   }
}